

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

string * __thiscall
cmLocalUnixMakefileGenerator3::CreateMakeVariable
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,string *s,string *s2)

{
  int iVar1;
  pointer pcVar2;
  cmLocalUnixMakefileGenerator3 *pcVar3;
  iterator iVar4;
  long *plVar5;
  const_iterator cVar6;
  mapped_type *pmVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  long *plVar9;
  long lVar10;
  char cVar11;
  uint uVar12;
  string unmodified;
  string str1;
  char buffer_1 [5];
  char buffer [5];
  key_type local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  string *local_98;
  char local_8d [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  cmLocalUnixMakefileGenerator3 *local_48;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_38;
  
  paVar8 = &local_118.field_2;
  pcVar2 = (s->_M_dataplus)._M_p;
  local_118._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar2,pcVar2 + s->_M_string_length);
  std::__cxx11::string::_M_append((char *)&local_118,(ulong)(s2->_M_dataplus)._M_p);
  if (this->MakefileVariableSize == 0) {
    cVar11 = (char)&local_118;
    lVar10 = std::__cxx11::string::find(cVar11,0x2e);
    if ((((lVar10 == -1) && (this->MakefileVariableSize == 0)) &&
        (lVar10 = std::__cxx11::string::find(cVar11,0x2b), lVar10 == -1)) &&
       ((this->MakefileVariableSize == 0 &&
        (lVar10 = std::__cxx11::string::find(cVar11,0x2d), lVar10 == -1)))) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p == paVar8) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                      local_118.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_118.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_118._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                      local_118.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = local_118._M_string_length;
      local_118._M_string_length = 0;
      local_118.field_2._M_local_buf[0] = '\0';
      local_118._M_dataplus._M_p = (pointer)paVar8;
      goto LAB_003c1ed9;
    }
  }
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->MakeVariableMap)._M_t,&local_118);
  if ((_Rb_tree_header *)iVar4._M_node !=
      &(this->MakeVariableMap)._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*(long *)(iVar4._M_node + 2),
               (long)&(iVar4._M_node[2]._M_parent)->_M_color + *(long *)(iVar4._M_node + 2));
    goto LAB_003c1ed9;
  }
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  local_40 = &this->MakeVariableMap;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,local_118._M_dataplus._M_p,
             local_118._M_dataplus._M_p + local_118._M_string_length);
  iVar1 = this->MakefileVariableSize;
  local_48 = this;
  if (iVar1 == 0) {
    if (CONCAT44(local_f8._M_string_length._4_4_,(int)local_f8._M_string_length) != 0) {
      lVar10 = 0;
      do {
        if (local_f8._M_dataplus._M_p[lVar10] == '.') {
          local_f8._M_dataplus._M_p[lVar10] = '_';
        }
        lVar10 = lVar10 + 1;
      } while (CONCAT44(local_f8._M_string_length._4_4_,(int)local_f8._M_string_length) != lVar10);
    }
    cmsys::SystemTools::ReplaceString(&local_f8,"-","__");
    cmsys::SystemTools::ReplaceString(&local_f8,"+","___");
    uVar12 = 0;
    local_98 = __return_storage_ptr__;
    while ((cVar6 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::find(&(this->ShortMakeVariableMap)._M_t,&local_f8), uVar12 < 1000 &&
           ((_Rb_tree_header *)cVar6._M_node !=
            &(this->ShortMakeVariableMap)._M_t._M_impl.super__Rb_tree_header))) {
      uVar12 = uVar12 + 1;
      sprintf((char *)&local_88,"%04d",(ulong)uVar12);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,local_118._M_dataplus._M_p,
                 local_118._M_dataplus._M_p + local_118._M_string_length);
      std::__cxx11::string::append((char *)&local_d8);
      std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
    }
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->ShortMakeVariableMap,&local_f8);
    std::__cxx11::string::_M_replace((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,0x59a7f8);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_40,&local_118);
    std::__cxx11::string::_M_assign((string *)pmVar7);
    paVar8 = &local_98->field_2;
    (local_98->_M_dataplus)._M_p = (pointer)paVar8;
    __return_storage_ptr__ = local_98;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) goto LAB_003c1ebc;
LAB_003c1ecd:
    *(undefined4 *)paVar8 = local_f8.field_2._M_allocated_capacity._0_4_;
    *(undefined4 *)((long)paVar8 + 4) = local_f8.field_2._M_allocated_capacity._4_4_;
    *(undefined4 *)((long)paVar8 + 8) = local_f8.field_2._8_4_;
    *(undefined4 *)((long)paVar8 + 0xc) = local_f8.field_2._12_4_;
  }
  else {
    if (iVar1 < (int)local_f8._M_string_length) {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      pcVar2 = (s->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,pcVar2,pcVar2 + s->_M_string_length);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      pcVar2 = (s2->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar2,pcVar2 + s2->_M_string_length);
      if (iVar1 + -8 < (int)local_88._M_string_length) {
        std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_88);
        std::__cxx11::string::operator=((string *)&local_88,(string *)&local_b8);
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
      }
      if (iVar1 + -5 < (int)local_88._M_string_length + (int)local_d8._M_string_length) {
        std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_d8);
        std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_b8);
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
      }
      sprintf(local_8d,"%04d",0);
      std::operator+(&local_68,&local_d8,&local_88);
      local_98 = __return_storage_ptr__;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_68);
      pcVar3 = local_48;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_a8 = *plVar9;
        lStack_a0 = plVar5[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *plVar9;
        local_b8 = (long *)*plVar5;
      }
      local_b0 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_b8);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      local_38 = &pcVar3->ShortMakeVariableMap;
      uVar12 = 1;
      while ((cVar6 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::find(&local_38->_M_t,&local_f8), uVar12 - 1 < 1000 &&
             ((_Rb_tree_header *)cVar6._M_node !=
              &(pcVar3->ShortMakeVariableMap)._M_t._M_impl.super__Rb_tree_header))) {
        sprintf(local_8d,"%04d",(ulong)uVar12);
        std::operator+(&local_68,&local_d8,&local_88);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_68);
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_a8 = *plVar9;
          lStack_a0 = plVar5[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *plVar9;
          local_b8 = (long *)*plVar5;
        }
        local_b0 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_b8);
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        uVar12 = uVar12 + 1;
      }
      if (uVar12 == 0x3e9) {
        cmSystemTools::Error
                  ("Borland makefile variable length too long",(char *)0x0,(char *)0x0,(char *)0x0);
        (local_98->_M_dataplus)._M_p = (pointer)&local_98->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p == &local_118.field_2) {
          (local_98->field_2)._M_allocated_capacity =
               CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                        local_118.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&local_98->field_2 + 8) = local_118.field_2._8_8_;
        }
        else {
          (local_98->_M_dataplus)._M_p = local_118._M_dataplus._M_p;
          (local_98->field_2)._M_allocated_capacity =
               CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                        local_118.field_2._M_local_buf[0]);
        }
        local_98->_M_string_length = local_118._M_string_length;
        local_118._M_string_length = 0;
        local_118.field_2._M_local_buf[0] = '\0';
        __return_storage_ptr__ = local_98;
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      }
      else {
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](local_38,&local_f8);
        __return_storage_ptr__ = local_98;
        std::__cxx11::string::_M_replace((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,0x59a7f8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if (uVar12 == 0x3e9) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,
                          CONCAT44(local_f8.field_2._M_allocated_capacity._4_4_,
                                   local_f8.field_2._M_allocated_capacity._0_4_) + 1);
        }
        goto LAB_003c1ed9;
      }
    }
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_40,&local_118);
    std::__cxx11::string::_M_assign((string *)pmVar7);
    paVar8 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == &local_f8.field_2) goto LAB_003c1ecd;
LAB_003c1ebc:
    (__return_storage_ptr__->_M_dataplus)._M_p = local_f8._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT44(local_f8.field_2._M_allocated_capacity._4_4_,
                  local_f8.field_2._M_allocated_capacity._0_4_);
  }
  __return_storage_ptr__->_M_string_length =
       CONCAT44(local_f8._M_string_length._4_4_,(int)local_f8._M_string_length);
LAB_003c1ed9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::CreateMakeVariable(
  std::string const& s, std::string const& s2)
{
  std::string unmodified = s;
  unmodified += s2;
  // if there is no restriction on the length of make variables
  // and there are no "." characters in the string, then return the
  // unmodified combination.
  if ((!this->MakefileVariableSize &&
       unmodified.find('.') == std::string::npos) &&
      (!this->MakefileVariableSize &&
       unmodified.find('+') == std::string::npos) &&
      (!this->MakefileVariableSize &&
       unmodified.find('-') == std::string::npos)) {
    return unmodified;
  }

  // see if the variable has been defined before and return
  // the modified version of the variable
  std::map<std::string, std::string>::iterator i =
    this->MakeVariableMap.find(unmodified);
  if (i != this->MakeVariableMap.end()) {
    return i->second;
  }
  // start with the unmodified variable
  std::string ret = unmodified;
  // if this there is no value for this->MakefileVariableSize then
  // the string must have bad characters in it
  if (!this->MakefileVariableSize) {
    std::replace(ret.begin(), ret.end(), '.', '_');
    cmSystemTools::ReplaceString(ret, "-", "__");
    cmSystemTools::ReplaceString(ret, "+", "___");
    int ni = 0;
    char buffer[5];
    // make sure the _ version is not already used, if
    // it is used then add number to the end of the variable
    while (this->ShortMakeVariableMap.count(ret) && ni < 1000) {
      ++ni;
      sprintf(buffer, "%04d", ni);
      ret = unmodified + buffer;
    }
    this->ShortMakeVariableMap[ret] = "1";
    this->MakeVariableMap[unmodified] = ret;
    return ret;
  }

  // if the string is greater than 32 chars it is an invalid variable name
  // for borland make
  if (static_cast<int>(ret.size()) > this->MakefileVariableSize) {
    int keep = this->MakefileVariableSize - 8;
    int size = keep + 3;
    std::string str1 = s;
    std::string str2 = s2;
    // we must shorten the combined string by 4 characters
    // keep no more than 24 characters from the second string
    if (static_cast<int>(str2.size()) > keep) {
      str2 = str2.substr(0, keep);
    }
    if (static_cast<int>(str1.size()) + static_cast<int>(str2.size()) > size) {
      str1 = str1.substr(0, size - str2.size());
    }
    char buffer[5];
    int ni = 0;
    sprintf(buffer, "%04d", ni);
    ret = str1 + str2 + buffer;
    while (this->ShortMakeVariableMap.count(ret) && ni < 1000) {
      ++ni;
      sprintf(buffer, "%04d", ni);
      ret = str1 + str2 + buffer;
    }
    if (ni == 1000) {
      cmSystemTools::Error("Borland makefile variable length too long");
      return unmodified;
    }
    // once an unused variable is found
    this->ShortMakeVariableMap[ret] = "1";
  }
  // always make an entry into the unmodified to variable map
  this->MakeVariableMap[unmodified] = ret;
  return ret;
}